

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool read_line(bufchain *input,strbuf *output,_Bool is_header)

{
  _Bool _Var1;
  undefined8 in_RAX;
  undefined8 uStack_38;
  char c;
  
  uStack_38 = in_RAX;
  do {
    while( true ) {
      _Var1 = bufchain_try_fetch(input,&c,1);
      if (!_Var1) {
        return _Var1;
      }
      if (!is_header) break;
      if ((output->len == 0) || (output->s[output->len - 1] != '\n')) {
        BinarySink_put_byte(output->binarysink_,c);
        bufchain_consume(input,1);
      }
      else if ((c != '\t') && (c != ' ')) goto LAB_0014181c;
    }
    BinarySink_put_byte(output->binarysink_,c);
    bufchain_consume(input,1);
  } while ((output->len == 0) || (output->s[output->len - 1] != '\n'));
LAB_0014181c:
  strbuf_chomp(output,'\n');
  strbuf_chomp(output,'\r');
  return _Var1;
}

Assistant:

static bool read_line(bufchain *input, strbuf *output, bool is_header)
{
    char c;

    while (bufchain_try_fetch(input, &c, 1)) {
        if (is_header && output->len > 0 &&
            output->s[output->len - 1] == '\n') {
            /*
             * A newline terminates the header, provided we're sure it
             * is _not_ followed by a space or a tab.
             */
            if (c != ' ' && c != '\t')
                goto done;  /* we have a complete header line */
        } else {
            put_byte(output, c);
            bufchain_consume(input, 1);

            if (!is_header && output->len > 0 &&
                output->s[output->len - 1] == '\n') {
                /* If we're looking for just a line, not an HTTP
                 * header, then any newline terminates it. */
                goto done;
            }
        }
    }

    return false;

  done:
    strbuf_chomp(output, '\n');
    strbuf_chomp(output, '\r');
    return true;
}